

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall
UnscentedKalmanFilter::PredictMeanAndCovariance
          (UnscentedKalmanFilter *this,MatrixXd *Xsig_pred,VectorXd *x,MatrixXd *P)

{
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  CoeffReturnType pdVar1;
  ostream *poVar2;
  DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *m;
  bool bVar3;
  undefined1 local_310 [8];
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> es;
  Eigen local_220 [16];
  Type local_210;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>
  local_1e0;
  ConstColXpr local_1c8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1a0;
  ConstColXpr local_168;
  ConstColXpr local_130;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_108;
  undefined1 local_b0 [8];
  VectorXd x_diff;
  undefined1 local_98 [4];
  int i_1;
  ScalarMultipleReturnType local_70;
  int local_3c;
  Scalar SStack_38;
  int i;
  Scalar local_30;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_28;
  MatrixXd *P_local;
  VectorXd *x_local;
  MatrixXd *Xsig_pred_local;
  UnscentedKalmanFilter *this_local;
  
  local_30 = 0.0;
  local_28 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)P;
  P_local = (MatrixXd *)x;
  x_local = (VectorXd *)Xsig_pred;
  Xsig_pred_local = (MatrixXd *)this;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::fill
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x,&local_30);
  SStack_38 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::fill
            (local_28,&stack0xffffffffffffffc8);
  for (local_3c = 0; local_3c < this->n_sigma_; local_3c = local_3c + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &this->weights_m_,(long)local_3c);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((ConstColXpr *)local_98,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)x_local,(long)local_3c);
    Eigen::operator*(&local_70,pdVar1,(StorageBaseType *)local_98);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)P_local,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_70);
  }
  NormalizeState(this,(VectorXd *)P_local);
  bVar3 = true;
  if (this->type_ != UKFModified) {
    bVar3 = this->type_ == UKFEnhanced;
  }
  for (x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
            = (uint)bVar3;
      (int)x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
           _4_4_ < this->n_sigma_;
      x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
           x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
           _4_4_ + 1) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_b0);
    if ((this->type_ == UKFModified) || (this->type_ == UKFEnhanced)) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_130,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)x_local,
                 (long)(int)x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows._4_4_);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_168,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)x_local,0);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::operator-
                (&local_108,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                 &local_130,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                  *)&local_168);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,_1,1,0,_1,1> *)local_b0,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)&local_108);
    }
    else {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_1c8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)x_local,
                 (long)(int)x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows._4_4_);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::operator-
                (&local_1a0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
                 &local_1c8,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)P_local);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,_1,1,0,_1,1> *)local_b0,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_1a0);
    }
    NormalizeState(this,(VectorXd *)local_b0);
    this_00 = local_28;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &this->weights_c_,
                        (long)(int)x_diff.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows._4_4_);
    Eigen::operator*(local_220,pdVar1,(StorageBaseType *)local_b0);
    es.m_tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (DenseIndex)
         Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                   ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b0);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*(&local_210,
                (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)local_220,
                (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                &es.m_tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
              (&local_1e0,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_00,
               (MatrixBase<Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>
                *)&local_210);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,_1,_1,0,_1,_1> *)local_28,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                *)&local_1e0);
    Eigen::
    GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_2>
    ::~GeneralProduct(&local_210);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_b0);
  }
  if (2 < this->debug_) {
    poVar2 = std::operator<<((ostream *)&std::cout,"x pred:\n");
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)P_local)
    ;
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"P pred:\n");
    poVar2 = Eigen::operator<<(poVar2,local_28);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver
              ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_310,
               (MatrixType *)local_28,true);
    poVar2 = std::operator<<((ostream *)&std::cout,"Eigenvalues of P pred:\n");
    m = (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)
        Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvalues
                  ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_310);
    poVar2 = Eigen::operator<<(poVar2,m);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~EigenSolver
              ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_310);
  }
  return;
}

Assistant:

void UnscentedKalmanFilter::PredictMeanAndCovariance(const MatrixXd &Xsig_pred, VectorXd &x, MatrixXd &P) const {

  x.fill(0.0);
  P.fill(0.0);

  // predicted state mean
  for (int i=0; i<n_sigma_; i++) {  // iterate over sigma points
      x += weights_m_(i) * Xsig_pred.col(i);
      //std::cout << i << std::fixed << ": " << x.transpose() << std::endl;
  }
  NormalizeState(x);

  // predicted state covariance matrix
  for (int i=(type_==UKFModified||type_==UKFEnhanced)?1:0; i<n_sigma_; i++) {  // iterate over sigma points

    // state difference
    VectorXd x_diff;
    if (type_==UKFModified||type_==UKFEnhanced)
        x_diff = Xsig_pred.col(i) - Xsig_pred.col(0);
    else
        x_diff = Xsig_pred.col(i) - x;

    NormalizeState(x_diff);

    P = P + weights_c_(i) * x_diff * x_diff.transpose();
  }

  if (debug_ > 2) {
    std::cout << "x pred:\n" << x << std::endl;
    std::cout << "P pred:\n" << P << std::endl;
    Eigen::EigenSolver<MatrixXd> es(P);
    std::cout << "Eigenvalues of P pred:\n" << es.eigenvalues() << std::endl;
  }
}